

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::getModifyIntensityApertureDiff_abi_cxx11_(Station *this,int aperture,double size)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_00;
  int in_EDX;
  long in_RSI;
  key_type *in_RDI;
  double in_XMM0_Qa;
  pair<int,_double> pVar5;
  int j;
  int beamlet;
  int i;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  double *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  key_type *this_01;
  int local_4c;
  int local_2c;
  
  this_01 = in_RDI;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x13c1be);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
  if ((*pvVar2 + in_XMM0_Qa < 0.0) ||
     (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX),
     (double)*(int *)(in_RSI + 0x44) < *pvVar2 + in_XMM0_Qa)) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
    if (0.0 <= *pvVar2 + in_XMM0_Qa) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      if (*pvVar2 + in_XMM0_Qa <= (double)*(int *)(in_RSI + 0x44)) {
        return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01;
      }
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      if ((double)*(int *)(in_RSI + 0x44) <= *pvVar2) {
        return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01;
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
      if (*pvVar2 <= 0.0) {
        return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01;
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_EDX);
    }
  }
  for (local_2c = 0; iVar1 = Collimator::getXdim(*(Collimator **)(in_RSI + 0xb0)), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pvVar3 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RSI + 0x58),(long)in_EDX);
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar3,(long)local_2c);
    if (-1 < pvVar4->first) {
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_EDX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)local_2c);
      if (-1 < pvVar4->second) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_EDX);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (pvVar3,(long)local_2c);
        std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff48,(int *)0x13c49d);
        this_00 = (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  std::
                  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                                *)this_01,in_RDI);
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_EDX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_2c);
        local_4c = pvVar4->first;
        while( true ) {
          iVar1 = local_4c;
          pvVar3 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RSI + 0x58),(long)in_EDX);
          pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar3,(long)local_2c);
          if (pvVar4->second < iVar1) break;
          pVar5 = std::make_pair<int&,double&>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff50 = (int *)pVar5.second;
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          push_back(this_00,(value_type *)CONCAT44(iVar1,pVar5.first));
          local_4c = local_4c + 1;
        }
      }
    }
  }
  return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01;
}

Assistant:

list <pair< int,double> > Station::getModifyIntensityApertureDiff (int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    return(diff);
    
  }